

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep_coefficients.c
# Opt level: O0

SplittingStepCoefficients
SplittingStepCoefficients_Create
          (int sequential_methods,int stages,int partitions,int order,sunrealtype *alpha,
          sunrealtype *beta)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  void *in_R8;
  void *in_R9;
  SplittingStepCoefficients coefficients;
  undefined8 in_stack_fffffffffffffff8;
  SplittingStepCoefficients pSVar1;
  
  if (((in_R8 == (void *)0x0) || (in_R9 == (void *)0x0)) || (in_ECX < 1)) {
    pSVar1 = (SplittingStepCoefficients)0x0;
  }
  else {
    pSVar1 = SplittingStepCoefficients_Alloc
                       ((int)((ulong)in_stack_fffffffffffffff8 >> 0x20),
                        (int)in_stack_fffffffffffffff8,in_EDI);
    if (pSVar1 == (SplittingStepCoefficients)0x0) {
      pSVar1 = (SplittingStepCoefficients)0x0;
    }
    else {
      pSVar1->order = in_ECX;
      memcpy(pSVar1->alpha,in_R8,(long)in_EDI << 3);
      memcpy(**pSVar1->beta,in_R9,(long)(in_EDI * (in_ESI + 1) * in_EDX) << 3);
    }
  }
  return pSVar1;
}

Assistant:

SplittingStepCoefficients SplittingStepCoefficients_Create(
  const int sequential_methods, const int stages, const int partitions,
  const int order, sunrealtype* const alpha, sunrealtype* const beta)
{
  if (alpha == NULL || beta == NULL || order < 1) { return NULL; }

  SplittingStepCoefficients coefficients =
    SplittingStepCoefficients_Alloc(sequential_methods, stages, partitions);
  if (coefficients == NULL) { return NULL; }

  coefficients->order = order;
  memcpy(coefficients->alpha, alpha, sequential_methods * sizeof(sunrealtype));
  memcpy(coefficients->beta[0][0], beta,
         sequential_methods * (stages + 1) * partitions * sizeof(sunrealtype));

  return coefficients;
}